

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

bcf_sr_regions_t * bcf_sr_regions_init(char *regions,int is_file,int ichr,int ifrom,int ito)

{
  int iVar1;
  htsFile *phVar2;
  tbx_t *ptVar3;
  size_t sVar4;
  char **ppcVar5;
  void *pvVar6;
  char *pcVar7;
  int *piVar8;
  int *piVar10;
  int local_58;
  int local_54;
  int i;
  int ret;
  int to;
  int from;
  char *chr_end;
  char *chr;
  int is_bed;
  int len;
  bcf_sr_regions_t *reg;
  int ito_local;
  int ifrom_local;
  int ichr_local;
  int is_file_local;
  char *regions_local;
  undefined4 uVar9;
  undefined4 uVar11;
  
  reg._0_4_ = ito;
  reg._4_4_ = ifrom;
  ito_local = ichr;
  ifrom_local = is_file;
  _ichr_local = regions;
  if (is_file == 0) {
    regions_local = (char *)_regions_init_string(regions);
  }
  else {
    _is_bed = (bcf_sr_regions_t *)calloc(1,0xb0);
    _is_bed->end = -1;
    _is_bed->start = -1;
    _is_bed->prev_seq = -1;
    _is_bed->prev_start = -1;
    phVar2 = hts_open(_ichr_local,"rb");
    _is_bed->file = phVar2;
    if (_is_bed->file == (htsFile *)0x0) {
      fprintf(_stderr,"[%s:%d %s] Could not open file: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0x3dd,"bcf_sr_regions_init",_ichr_local);
      free(_is_bed);
      regions_local = (char *)0x0;
    }
    else {
      ptVar3 = tbx_index_load(_ichr_local);
      _is_bed->tbx = ptVar3;
      if (_is_bed->tbx == (tbx_t *)0x0) {
        sVar4 = strlen(_ichr_local);
        chr._4_4_ = (int)sVar4;
        iVar1 = strcasecmp(".bed",_ichr_local + (long)chr._4_4_ + -4);
        chr._0_4_ = (uint)(iVar1 == 0);
        if (((uint)chr == 0) &&
           (iVar1 = strcasecmp(".bed.gz",_ichr_local + (long)chr._4_4_ + -7), iVar1 == 0)) {
          chr._0_4_ = 1;
        }
        if ((_is_bed->file->format).format == vcf) {
          reg._0_4_ = 1;
        }
        while (iVar1 = hts_getline(_is_bed->file,2,&_is_bed->line), 0 < iVar1) {
          iVar1 = (int)reg;
          if ((int)reg < 1) {
            iVar1 = -(int)reg;
          }
          piVar8 = &ret;
          piVar10 = &i;
          local_54 = _regions_parse_line((_is_bed->line).s,ito_local,reg._4_4_,iVar1,&chr_end,
                                         (char **)&to,piVar8,piVar10);
          uVar11 = (undefined4)((ulong)piVar10 >> 0x20);
          uVar9 = (undefined4)((ulong)piVar8 >> 0x20);
          if (local_54 < 0) {
            if ((int)reg < 0) {
              piVar8 = &ret;
              piVar10 = &i;
              local_54 = _regions_parse_line((_is_bed->line).s,ito_local,reg._4_4_,reg._4_4_,
                                             &chr_end,(char **)&to,piVar8,piVar10);
              uVar11 = (undefined4)((ulong)piVar10 >> 0x20);
              uVar9 = (undefined4)((ulong)piVar8 >> 0x20);
            }
            if (local_54 < 0) {
              fprintf(_stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                      ,0x3f7,_ichr_local,(ulong)(ito_local + 1),CONCAT44(uVar9,reg._4_4_ + 1),
                      CONCAT44(uVar11,(int)reg + 1));
              hts_close(_is_bed->file);
              _is_bed->file = (htsFile *)0x0;
              free(_is_bed);
              return (bcf_sr_regions_t *)0x0;
            }
          }
          if (local_54 != 0) {
            if ((uint)chr != 0) {
              ret = ret + 1;
            }
            *_to = '\0';
            _regions_add(_is_bed,chr_end,ret,i);
            *_to = '\t';
          }
        }
        hts_close(_is_bed->file);
        _is_bed->file = (htsFile *)0x0;
        if (_is_bed->nseqs == 0) {
          free(_is_bed);
          regions_local = (char *)0x0;
        }
        else {
          regions_local = (char *)_is_bed;
        }
      }
      else {
        ppcVar5 = tbx_seqnames(_is_bed->tbx,&_is_bed->nseqs);
        _is_bed->seq_names = ppcVar5;
        if (_is_bed->seq_hash == (void *)0x0) {
          pvVar6 = khash_str2int_init();
          _is_bed->seq_hash = pvVar6;
        }
        for (local_58 = 0; local_58 < _is_bed->nseqs; local_58 = local_58 + 1) {
          khash_str2int_set(_is_bed->seq_hash,_is_bed->seq_names[local_58],local_58);
        }
        pcVar7 = strdup(_ichr_local);
        _is_bed->fname = pcVar7;
        _is_bed->is_bin = 1;
        regions_local = (char *)_is_bed;
      }
    }
  }
  return (bcf_sr_regions_t *)regions_local;
}

Assistant:

bcf_sr_regions_t *bcf_sr_regions_init(const char *regions, int is_file, int ichr, int ifrom, int ito)
{
    bcf_sr_regions_t *reg;
    if ( !is_file ) return _regions_init_string(regions);

    reg = (bcf_sr_regions_t *) calloc(1, sizeof(bcf_sr_regions_t));
    reg->start = reg->end = -1;
    reg->prev_start = reg->prev_seq = -1;

    reg->file = hts_open(regions, "rb");
    if ( !reg->file )
    {
        fprintf(stderr,"[%s:%d %s] Could not open file: %s\n", __FILE__,__LINE__,__FUNCTION__,regions);
        free(reg);
        return NULL;
    }

    reg->tbx = tbx_index_load(regions);
    if ( !reg->tbx )
    {
        int len = strlen(regions);
        int is_bed  = strcasecmp(".bed",regions+len-4) ? 0 : 1;
        if ( !is_bed && !strcasecmp(".bed.gz",regions+len-7) ) is_bed = 1;

        if ( reg->file->format.format==vcf ) ito = 1;

        // read the whole file, tabix index is not present
        while ( hts_getline(reg->file, KS_SEP_LINE, &reg->line) > 0 )
        {
            char *chr, *chr_end;
            int from, to, ret;
            ret = _regions_parse_line(reg->line.s, ichr,ifrom,abs(ito), &chr,&chr_end,&from,&to);
            if ( ret < 0 )
            {
                if ( ito<0 )
                    ret = _regions_parse_line(reg->line.s, ichr,ifrom,ifrom, &chr,&chr_end,&from,&to);
                if ( ret<0 )
                {
                    fprintf(stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n", __FILE__,__LINE__,regions,ichr+1,ifrom+1,ito+1);
                    hts_close(reg->file); reg->file = NULL; free(reg);
                    return NULL;
                }
            }
            if ( !ret ) continue;
            if ( is_bed ) from++;
            *chr_end = 0;
            _regions_add(reg, chr, from, to);
            *chr_end = '\t';
        }
        hts_close(reg->file); reg->file = NULL;
        if ( !reg->nseqs ) { free(reg); return NULL; }
        return reg;
    }

    reg->seq_names = (char**) tbx_seqnames(reg->tbx, &reg->nseqs);
    if ( !reg->seq_hash )
        reg->seq_hash = khash_str2int_init();
    int i;
    for (i=0; i<reg->nseqs; i++)
    {
        khash_str2int_set(reg->seq_hash,reg->seq_names[i],i);
    }
    reg->fname  = strdup(regions);
    reg->is_bin = 1;
    return reg;
}